

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O1

bool __thiscall Divide<1,_0,_1>::propagate(Divide<1,_0,_1> *this)

{
  int iVar1;
  int iVar2;
  IntVar *pIVar3;
  IntVar *pIVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  
  pIVar3 = (this->x).var;
  pIVar4 = (this->y).var;
  uVar10 = (ulong)(pIVar3->max).v;
  iVar7 = (pIVar3->min).v;
  lVar16 = (long)(pIVar4->min).v;
  lVar15 = (long)(pIVar4->max).v;
  pIVar4 = (this->z).var;
  iVar1 = (pIVar4->max).v;
  lVar14 = -(long)iVar1;
  iVar2 = (pIVar4->min).v;
  lVar8 = (long)(~uVar10 + lVar15) / lVar15;
  if (lVar8 != lVar14 && SBORROW8(lVar8,lVar14) == lVar8 + iVar1 < 0) {
    if (so.lazy) {
      iVar5 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar11 = (ulong)uVar6 << 0x20 | (long)iVar5 << 2 | 3;
    }
    else {
      uVar11 = 0;
    }
    pIVar3 = (this->z).var;
    iVar5 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])(pIVar3,-lVar8,uVar11,1);
    if ((char)iVar5 == '\0') {
      return false;
    }
  }
  lVar13 = -(long)iVar7;
  lVar8 = (lVar16 + lVar13 + -1) / lVar16;
  lVar9 = (long)(((this->z).var)->min).v;
  if (SBORROW8(lVar8,-lVar9) != lVar8 + lVar9 < 0) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar11 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar11 = 0;
    }
    pIVar3 = (this->z).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])(pIVar3,-lVar8,uVar11,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  uVar11 = lVar16 * (lVar14 + -1);
  lVar8 = (long)(((this->x).var)->max).v;
  if (SBORROW8(uVar11,-lVar8) == (long)(uVar11 + lVar8) < 0) {
    if (so.lazy == true) {
      iVar7 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar12 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar12 = 0;
    }
    pIVar3 = (this->x).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])(pIVar3,~uVar11,uVar12,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  lVar16 = -(long)iVar2;
  lVar15 = lVar15 * lVar16;
  lVar8 = (long)(((this->x).var)->min).v;
  if (SBORROW8(lVar15,-lVar8) != lVar15 + lVar8 < 0) {
    if (so.lazy == true) {
      iVar7 = (*(((this->y).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar11 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar11 = 0;
    }
    pIVar3 = (this->x).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])(pIVar3,-lVar15,uVar11,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  if ((iVar2 < 0) &&
     (lVar16 = (long)((lVar16 - uVar10) + -1) / lVar16, (((this->y).var)->min).v < lVar16)) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar10 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar3 = (this->y).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xe])(pIVar3,lVar16,uVar10,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
  }
  if (-2 < iVar1) {
    return true;
  }
  lVar8 = (lVar13 + lVar14 + -2) / (lVar14 + -1);
  if (lVar8 <= (((this->y).var)->max).v) {
    if (so.lazy == true) {
      iVar7 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
      uVar6 = (*(((this->z).var)->super_Var).super_Branching._vptr_Branching[9])();
      uVar10 = (ulong)uVar6 << 0x20 | (long)iVar7 << 2 | 3;
    }
    else {
      uVar10 = 0;
    }
    pIVar3 = (this->y).var;
    iVar7 = (*(pIVar3->super_Var).super_Branching._vptr_Branching[0xf])(pIVar3,lVar8 + -1,uVar10,1);
    if ((char)iVar7 == '\0') {
      return false;
    }
    return true;
  }
  return true;
}

Assistant:

bool propagate() override {
		const int64_t x_min = x.getMin();
		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();
		const int64_t y_max = y.getMax();
		const int64_t z_min = z.getMin();
		const int64_t z_max = z.getMax();

		// z >= ceil(x.min / y.max)
		setDom(z, setMin, (x_min + y_max - 1) / y_max, x.getMinLit(), y.getMaxLit());
		// z <= ceil(x.max / y.min)
		setDom(z, setMax, (x_max + y_min - 1) / y_min, x.getMaxLit(), y.getMinLit());

		// x >= y.min * (z.min - 1) + 1
		setDom(x, setMin, y_min * (z_min - 1) + 1, y.getMinLit(), z.getMinLit());
		// x <= y.max * z.max
		setDom(x, setMax, y_max * z_max, y.getMaxLit(), z.getMaxLit());

		// y >= ceil(x.min / z.max)
		if (z_max >= 1) {
			setDom(y, setMin, (x_min + z_max - 1) / z_max, x.getMinLit(), z.getMaxLit());
		}

		// y <= ceil(x.max / z.min-1) - 1
		if (z_min >= 2) {
			setDom(y, setMax, (x_max + z_min - 2) / (z_min - 1) - 1, x.getMaxLit(), z.getMinLit());
		}

		return true;
	}